

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

QMdiArea * __thiscall QMdiSubWindow::mdiArea(QMdiSubWindow *this)

{
  long lVar1;
  bool bVar2;
  QAbstractScrollArea *this_00;
  QWidget *pQVar3;
  QAbstractScrollArea *unaff_R14;
  
  lVar1 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
  while( true ) {
    if (lVar1 == 0) {
      return (QMdiArea *)0x0;
    }
    this_00 = (QAbstractScrollArea *)QMetaObject::cast((QObject *)&QMdiArea::staticMetaObject);
    if ((this_00 == (QAbstractScrollArea *)0x0) ||
       (pQVar3 = QAbstractScrollArea::viewport(this_00),
       pQVar3 != *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10))) {
      bVar2 = true;
      this_00 = unaff_R14;
    }
    else {
      bVar2 = false;
    }
    if (!bVar2) break;
    lVar1 = *(long *)(*(long *)(lVar1 + 8) + 0x10);
    unaff_R14 = this_00;
  }
  return (QMdiArea *)this_00;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }